

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float128_default_nan_mips(float_status *status)

{
  ulong uVar1;
  float128 fVar2;
  
  uVar1 = 0x2000000000000000;
  if (status->snan_bit_is_one != '\0') {
    uVar1 = 0x1fffffffffffffff;
  }
  fVar2.low = -(ulong)((uint)uVar1 & 1);
  fVar2.high = uVar1 >> 0xe | 0x7fff000000000000;
  return fVar2;
}

Assistant:

float128 float128_default_nan(float_status *status)
{
    FloatParts p = parts_default_nan(status);
    float128 r;

    /* Extrapolate from the choices made by parts_default_nan to fill
     * in the quad-floating format.  If the low bit is set, assume we
     * want to set all non-snan bits.
     */
#ifdef _MSC_VER
    r.low = 0ULL - (p.frac & 1);
#else
    r.low = -(p.frac & 1);
#endif
    r.high = p.frac >> (DECOMPOSED_BINARY_POINT - 48);
    r.high |= UINT64_C(0x7FFF000000000000);
    r.high |= (uint64_t)p.sign << 63;

    return r;
}